

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.hxx
# Opt level: O0

ptr<snapshot_sync_ctx> __thiscall nuraft::peer::get_snapshot_sync_ctx(peer *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<nuraft::snapshot_sync_ctx> *in_RSI;
  element_type *in_RDI;
  ptr<snapshot_sync_ctx> pVar1;
  lock_guard<std::mutex> l;
  mutex_type *in_stack_ffffffffffffffc8;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RSI,in_stack_ffffffffffffffc8);
  std::shared_ptr<nuraft::snapshot_sync_ctx>::shared_ptr
            (in_RSI,(shared_ptr<nuraft::snapshot_sync_ctx> *)in_stack_ffffffffffffffc8);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1ea636);
  pVar1.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  pVar1.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<snapshot_sync_ctx>)
         pVar1.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<snapshot_sync_ctx> get_snapshot_sync_ctx() const {
        std::lock_guard<std::mutex> l(snp_sync_ctx_lock_);
        return snp_sync_ctx_;
    }